

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorLinearDriveline::InjectConstraints
          (ChLinkMotorLinearDriveline *this,ChSystemDescriptor *mdescriptor)

{
  element_type *peVar1;
  element_type *peVar2;
  
  ChLinkMateGeneric::InjectConstraints((ChLinkMateGeneric *)this,mdescriptor);
  peVar1 = (this->innerconstraint1lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x31])(peVar1,mdescriptor);
  peVar1 = (this->innerconstraint2lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x31])(peVar1,mdescriptor);
  peVar2 = (this->innerconstraint2rot).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x31])(peVar2,mdescriptor);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::InjectConstraints(ChSystemDescriptor& mdescriptor) {
    // First, inherit to parent class
    ChLinkMotorLinear::InjectConstraints(mdescriptor);

    innerconstraint1lin->InjectConstraints(mdescriptor);
    innerconstraint2lin->InjectConstraints(mdescriptor);
    innerconstraint2rot->InjectConstraints(mdescriptor);
}